

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pragmaVtabConnect(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr
                     )

{
  long lVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 in_EDX;
  sqlite3 *in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  char cSep;
  int j;
  int i;
  int rc;
  PragmaVtab *pTab;
  PragmaName *pPragma;
  StrAccum acc;
  char zBuf [200];
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined3 in_stack_fffffffffffffeb8;
  uint uVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  int iVar10;
  undefined4 uVar11;
  void *local_138;
  undefined4 in_stack_fffffffffffffef0;
  sqlite3 *db_00;
  undefined1 local_f8 [24];
  undefined1 *local_e0;
  char local_d8 [40];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_138 = (void *)0x0;
  uVar11 = 0xaaaaaaaa;
  uVar9 = 0xaaaaaaaa;
  uVar6 = 0xaaaaaaaa;
  uVar4 = CONCAT13(0x28,in_stack_fffffffffffffeb8);
  local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  db_00 = in_RSI;
  memset(local_d8,0xaa,200);
  sqlite3StrAccumInit((StrAccum *)local_f8,(sqlite3 *)0x0,local_d8,200,0);
  sqlite3_str_appendall((sqlite3_str *)CONCAT44(uVar11,uVar9),(char *)CONCAT44(uVar6,uVar4));
  uVar2 = (uint)*(byte *)((long)&in_RSI->pVdbe + 2);
  for (iVar10 = 0; iVar10 < (int)(uint)*(byte *)((long)&in_RSI->pVdbe + 3); iVar10 = iVar10 + 1) {
    sqlite3_str_appendf((StrAccum *)local_f8,"%c\"%s\"",(ulong)(uint)(int)(char)(uVar4 >> 0x18),
                        pragCName[(int)uVar2]);
    uVar4 = CONCAT13(0x2c,(int3)uVar4);
    uVar2 = uVar2 + 1;
  }
  if (iVar10 == 0) {
    sqlite3_str_appendf((StrAccum *)local_f8,"(\"%s\"",in_RSI->pVfs);
    iVar10 = iVar10 + 1;
  }
  iVar7 = 0;
  if (((ulong)in_RSI->pVdbe & 0x2000) != 0) {
    sqlite3_str_appendall((sqlite3_str *)CONCAT44(uVar11,iVar10),(char *)(ulong)uVar4);
    iVar7 = iVar7 + 1;
  }
  if (((ulong)in_RSI->pVdbe & 0xc000) != 0) {
    sqlite3_str_appendall((sqlite3_str *)CONCAT44(uVar11,iVar10),(char *)CONCAT44(iVar7,uVar4));
    iVar7 = iVar7 + 1;
  }
  uVar8 = (undefined1)iVar10;
  sqlite3_str_append((sqlite3_str *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),0);
  sqlite3StrAccumFinish((StrAccum *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  iVar10 = sqlite3_declare_vtab(db_00,(char *)CONCAT44(in_EDX,in_stack_fffffffffffffef0));
  if (iVar10 == 0) {
    local_138 = sqlite3_malloc(in_stack_fffffffffffffeac);
    uVar5 = (undefined1)iVar7;
    if (local_138 == (void *)0x0) {
      iVar10 = 7;
    }
    else {
      memset(local_138,0,0x30);
      *(sqlite3 **)((long)local_138 + 0x20) = in_RSI;
      *(undefined8 *)((long)local_138 + 0x18) = in_RDI;
      *(undefined1 *)((long)local_138 + 0x29) = uVar8;
      *(undefined1 *)((long)local_138 + 0x28) = uVar5;
    }
  }
  else {
    pcVar3 = sqlite3_errmsg((sqlite3 *)CONCAT44(iVar7,uVar4));
    pcVar3 = sqlite3_mprintf("%s",pcVar3);
    *in_R9 = pcVar3;
  }
  *in_R8 = local_138;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

static int pragmaVtabConnect(
  sqlite3 *db,
  void *pAux,
  int argc, const char *const*argv,
  sqlite3_vtab **ppVtab,
  char **pzErr
){
  const PragmaName *pPragma = (const PragmaName*)pAux;
  PragmaVtab *pTab = 0;
  int rc;
  int i, j;
  char cSep = '(';
  StrAccum acc;
  char zBuf[200];

  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
  sqlite3_str_appendall(&acc, "CREATE TABLE x");
  for(i=0, j=pPragma->iPragCName; i<pPragma->nPragCName; i++, j++){
    sqlite3_str_appendf(&acc, "%c\"%s\"", cSep, pragCName[j]);
    cSep = ',';
  }
  if( i==0 ){
    sqlite3_str_appendf(&acc, "(\"%s\"", pPragma->zName);
    i++;
  }
  j = 0;
  if( pPragma->mPragFlg & PragFlg_Result1 ){
    sqlite3_str_appendall(&acc, ",arg HIDDEN");
    j++;
  }
  if( pPragma->mPragFlg & (PragFlg_SchemaOpt|PragFlg_SchemaReq) ){
    sqlite3_str_appendall(&acc, ",schema HIDDEN");
    j++;
  }
  sqlite3_str_append(&acc, ")", 1);
  sqlite3StrAccumFinish(&acc);
  assert( strlen(zBuf) < sizeof(zBuf)-1 );
  rc = sqlite3_declare_vtab(db, zBuf);
  if( rc==SQLITE_OK ){
    pTab = (PragmaVtab*)sqlite3_malloc(sizeof(PragmaVtab));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pTab, 0, sizeof(PragmaVtab));
      pTab->pName = pPragma;
      pTab->db = db;
      pTab->iHidden = i;
      pTab->nHidden = j;
    }
  }else{
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }

  *ppVtab = (sqlite3_vtab*)pTab;
  return rc;
}